

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O2

void FT_List_Up(FT_List list,FT_ListNode node)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  FT_ListNode pFVar3;
  
  if ((node != (FT_ListNode)0x0 && list != (FT_List)0x0) &&
     (pFVar1 = node->prev, pFVar1 != (FT_ListNode)0x0)) {
    pFVar2 = node->next;
    pFVar1->next = pFVar2;
    pFVar3 = (FT_ListNode)&list->tail;
    if (pFVar2 != (FT_ListNode)0x0) {
      pFVar3 = pFVar2;
    }
    pFVar3->prev = pFVar1;
    node->prev = (FT_ListNode)0x0;
    pFVar1 = list->head;
    node->next = pFVar1;
    pFVar1->prev = node;
    list->head = node;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Up( FT_List      list,
              FT_ListNode  node )
  {
    FT_ListNode  before, after;


    if ( !list || !node )
      return;

    before = node->prev;
    after  = node->next;

    /* check whether we are already on top of the list */
    if ( !before )
      return;

    before->next = after;

    if ( after )
      after->prev = before;
    else
      list->tail = before;

    node->prev       = NULL;
    node->next       = list->head;
    list->head->prev = node;
    list->head       = node;
  }